

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

void duckdb::StandardFixedSizeAppend::Append<duckdb::hugeint_t>
               (SegmentStatistics *stats,data_ptr_t target,idx_t target_offset,
               UnifiedVectorFormat *adata,idx_t offset,idx_t count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  undefined8 uVar3;
  data_ptr_t pdVar4;
  idx_t iVar5;
  long lVar6;
  bool bVar7;
  hugeint_t new_value;
  hugeint_t new_value_00;
  
  pdVar1 = adata->data;
  if ((adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pdVar4 = target + target_offset * 0x10;
    while (bVar7 = count != 0, count = count - 1, bVar7) {
      psVar2 = adata->sel->sel_vector;
      iVar5 = offset;
      if (psVar2 != (sel_t *)0x0) {
        iVar5 = (idx_t)psVar2[offset];
      }
      lVar6 = iVar5 * 0x10;
      new_value_00.upper = *(int64_t *)(pdVar1 + lVar6 + 8);
      new_value_00.lower = *(uint64_t *)(pdVar1 + lVar6);
      NumericStats::Update<duckdb::hugeint_t>
                (&(stats->statistics).stats_union.numeric_data,new_value_00);
      uVar3 = *(undefined8 *)(pdVar1 + lVar6 + 8);
      *(undefined8 *)pdVar4 = *(undefined8 *)(pdVar1 + lVar6);
      *(undefined8 *)(pdVar4 + 8) = uVar3;
      pdVar4 = pdVar4 + 0x10;
      offset = offset + 1;
    }
  }
  else {
    pdVar4 = target + target_offset * 0x10;
    while (bVar7 = count != 0, count = count - 1, bVar7) {
      psVar2 = adata->sel->sel_vector;
      iVar5 = offset;
      if (psVar2 != (sel_t *)0x0) {
        iVar5 = (idx_t)psVar2[offset];
      }
      bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(adata->validity).super_TemplatedValidityMask<unsigned_long>,iVar5);
      if (bVar7) {
        lVar6 = iVar5 * 0x10;
        new_value.upper = *(int64_t *)(pdVar1 + lVar6 + 8);
        new_value.lower = *(uint64_t *)(pdVar1 + lVar6);
        NumericStats::Update<duckdb::hugeint_t>
                  (&(stats->statistics).stats_union.numeric_data,new_value);
        uVar3 = *(undefined8 *)(pdVar1 + lVar6 + 8);
        *(undefined8 *)pdVar4 = *(undefined8 *)(pdVar1 + lVar6);
        *(undefined8 *)(pdVar4 + 8) = uVar3;
      }
      else {
        pdVar4[0] = '\0';
        pdVar4[1] = '\0';
        pdVar4[2] = '\0';
        pdVar4[3] = '\0';
        pdVar4[4] = '\0';
        pdVar4[5] = '\0';
        pdVar4[6] = '\0';
        pdVar4[7] = '\0';
        pdVar4[8] = '\0';
        pdVar4[9] = '\0';
        pdVar4[10] = '\0';
        pdVar4[0xb] = '\0';
        pdVar4[0xc] = '\0';
        pdVar4[0xd] = '\0';
        pdVar4[0xe] = '\0';
        pdVar4[0xf] = 0x80;
      }
      offset = offset + 1;
      pdVar4 = pdVar4 + 0x10;
    }
  }
  return;
}

Assistant:

static void Append(SegmentStatistics &stats, data_ptr_t target, idx_t target_offset, UnifiedVectorFormat &adata,
	                   idx_t offset, idx_t count) {
		auto sdata = UnifiedVectorFormat::GetData<T>(adata);
		auto tdata = reinterpret_cast<T *>(target);
		if (!adata.validity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				bool is_null = !adata.validity.RowIsValid(source_idx);
				if (!is_null) {
					stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
					tdata[target_idx] = sdata[source_idx];
				} else {
					// we insert a NullValue<T> in the null gap for debuggability
					// this value should never be used or read anywhere
					tdata[target_idx] = NullValue<T>();
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
				tdata[target_idx] = sdata[source_idx];
			}
		}
	}